

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x_vexp_fun.c
# Opt level: O3

void ex_sqrt(t_expr *e,long argc,ex_ex *argv,ex_ex *optr)

{
  float fVar1;
  int iVar2;
  t_float *ptVar3;
  t_float *ptVar4;
  long lVar5;
  t_float tVar6;
  double dVar7;
  
  lVar5 = argv->ex_type;
  if (lVar5 - 0xeU < 2) {
    if (optr->ex_type == 0xf) {
      ptVar4 = (optr->ex_cont).v_vec;
    }
    else {
      optr->ex_type = 0xf;
      ptVar4 = (t_float *)malloc((long)e->exp_vsize << 2);
      (optr->ex_cont).v_vec = ptVar4;
    }
    iVar2 = e->exp_vsize;
    if (iVar2 != 0) {
      ptVar3 = (argv->ex_cont).v_vec;
      lVar5 = 0;
      do {
        fVar1 = ptVar3[lVar5];
        if (fVar1 < 0.0) {
          tVar6 = sqrtf(fVar1);
        }
        else {
          tVar6 = SQRT(fVar1);
        }
        ptVar4[lVar5] = tVar6;
        lVar5 = lVar5 + 1;
      } while (iVar2 != (int)lVar5);
    }
  }
  else {
    if (lVar5 == 2) {
      if (optr->ex_type == 0xf) {
        ptVar4 = (optr->ex_cont).v_vec;
        fVar1 = (argv->ex_cont).v_flt;
        if (fVar1 < 0.0) {
          tVar6 = sqrtf(fVar1);
        }
        else {
          tVar6 = SQRT(fVar1);
        }
        goto LAB_0019ec38;
      }
      optr->ex_type = 2;
      fVar1 = (argv->ex_cont).v_flt;
      if (fVar1 < 0.0) {
        tVar6 = sqrtf(fVar1);
      }
      else {
        tVar6 = SQRT(fVar1);
      }
    }
    else {
      if (lVar5 != 1) {
        pd_error(e,"expr: FUNV_EVAL_UNARY(%d): bad left type %ld\n",0x27b);
        return;
      }
      if (optr->ex_type == 0xf) {
        dVar7 = (double)(argv->ex_cont).v_int;
        ptVar4 = (optr->ex_cont).v_vec;
        if (dVar7 < 0.0) {
          dVar7 = sqrt(dVar7);
        }
        else {
          dVar7 = SQRT(dVar7);
        }
        tVar6 = (t_float)dVar7;
LAB_0019ec38:
        ex_mkvector(ptVar4,tVar6,e->exp_vsize);
        return;
      }
      optr->ex_type = 2;
      dVar7 = (double)(argv->ex_cont).v_int;
      if (dVar7 < 0.0) {
        dVar7 = sqrt(dVar7);
      }
      else {
        dVar7 = SQRT(dVar7);
      }
      tVar6 = (t_float)dVar7;
    }
    (optr->ex_cont).v_flt = tVar6;
  }
  return;
}

Assistant:

static void
ex_sqrt(t_expr *e, long int argc, struct ex_ex *argv, struct ex_ex *optr)
{
        struct ex_ex *left;
        t_float *op; /* output pointer */
        t_float *lp, *rp;         /* left and right vector pointers */
        t_float scalar;
        int j;

        left = argv++;

        FUNC_EVAL_UNARY(left, sqrt, (double), optr, 1);
}